

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(QPDFAcroFormDocumentHelper *this,QPDF *qpdf)

{
  Members *__p;
  _Rb_tree_header *p_Var1;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFAcroFormDocumentHelper_002eafb0;
  __p = (Members *)operator_new(200);
  __p->cache_valid = false;
  p_Var1 = &(__p->field_to_annotations)._M_t._M_impl.super__Rb_tree_header;
  (__p->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__p->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__p->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__p->field_to_annotations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__p->annotation_to_field)._M_t._M_impl.super__Rb_tree_header;
  (__p->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (__p->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__p->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__p->annotation_to_field)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__p->field_to_name)._M_t._M_impl.super__Rb_tree_header;
  (__p->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p->field_to_name)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__p->name_to_fields)._M_t._M_impl.super__Rb_tree_header;
  (__p->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p->name_to_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m).super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFAcroFormDocumentHelper::Members*>
            (&(this->m).
              super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  analyze(this);
  return;
}

Assistant:

QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    // We have to analyze up front. Otherwise, when we are adding annotations and fields, we are in
    // a temporarily unstable configuration where some widget annotations are not reachable.
    analyze();
}